

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O2

void AddInclude(ZCC_ExprConstant *node)

{
  uint uVar1;
  
  if ((node->super_ZCC_Expression).Type == (PType *)TypeString) {
    uVar1 = TArray<FString,_FString>::Find(&Includes,(node->field_0).StringVal);
    if (Includes.Count <= uVar1) {
      TArray<FString,_FString>::Push(&Includes,(node->field_0).StringVal);
      ZCC_TreeNode::operator_cast_to_FScriptPosition((ZCC_TreeNode *)&stack0xffffffffffffffe0);
      TArray<FScriptPosition,_FScriptPosition>::Push
                (&IncludeLocs,(FScriptPosition *)&stack0xffffffffffffffe0);
      FString::~FString((FString *)&stack0xffffffffffffffe0);
    }
    return;
  }
  __assert_fail("node->Type == TypeString",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/zscript/zcc_parser.cpp"
                ,0x35,"void AddInclude(ZCC_ExprConstant *)");
}

Assistant:

void AddInclude(ZCC_ExprConstant *node)
{
	assert(node->Type == TypeString);
	if (Includes.Find(*node->StringVal) >= Includes.Size())
	{
		Includes.Push(*node->StringVal);
		IncludeLocs.Push(*node);
	}
}